

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::TFace>
          (Structure *this,TFace *dest,FileDatabase *db)

{
  ReadFieldArray2<2,float,4ul,2ul>(this,&dest->uv,"uv",db);
  ReadFieldArray<2,int,4ul>(this,&dest->col,"col",db);
  ReadField<1,char>(this,&dest->flag,"flag",db);
  ReadField<1,short>(this,&dest->mode,"mode",db);
  ReadField<1,short>(this,&dest->tile,"tile",db);
  ReadField<1,short>(this,&dest->unwrap,"unwrap",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<TFace> (
    TFace& dest,
    const FileDatabase& db
    ) const
{

    ReadFieldArray2<ErrorPolicy_Fail>(dest.uv,"uv",db);
    ReadFieldArray<ErrorPolicy_Fail>(dest.col,"col",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.mode,"mode",db);
    ReadField<ErrorPolicy_Igno>(dest.tile,"tile",db);
    ReadField<ErrorPolicy_Igno>(dest.unwrap,"unwrap",db);

    db.reader->IncPtr(size);
}